

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O0

bool __thiscall ASDCP::MXF::UTF16String::Archive(UTF16String *this,MemIOWriter *Writer)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ILogSink *pIVar4;
  size_t sVar5;
  bool result;
  int count;
  mbstate_t ps;
  ui32_t i;
  ui32_t length;
  ui32_t remainder;
  wchar_t wcp;
  char *mbp;
  MemIOWriter *Writer_local;
  UTF16String *this_local;
  
  mbp = (char *)Writer;
  Writer_local = (MemIOWriter *)this;
  uVar3 = std::__cxx11::string::size();
  if (uVar3 < 0x81) {
    _remainder = std::__cxx11::string::c_str();
    i = std::__cxx11::string::size();
    ps.__value.__wch = std::__cxx11::string::size();
    ps.__count = 0;
    memset(&stack0xffffffffffffffc0,0,8);
    for (; (uint)ps.__count < ps.__value.__wch; ps.__count = iVar2 + ps.__count) {
      sVar5 = mbrtowc((wchar_t *)&length,(char *)(_remainder + (ulong)(uint)ps.__count),(ulong)i,
                      (mbstate_t *)&stack0xffffffffffffffc0);
      iVar2 = (int)sVar5;
      if (iVar2 == -1) {
        pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error
                  (pIVar4,"Error decoding multi-byte sequence starting at offset %u\n",
                   (ulong)(uint)ps.__count);
        return false;
      }
      if (iVar2 == 0) break;
      bVar1 = Kumu::MemIOWriter::WriteUi16BE((MemIOWriter *)mbp,(ui16_t)length);
      if (!bVar1) {
        pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(pIVar4,"No more space in memory IO writer\n");
        return false;
      }
      i = i - iVar2;
    }
    this_local._7_1_ = true;
  }
  else {
    pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar4,"String length exceeds maximum %u bytes\n",0x80);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
ASDCP::MXF::UTF16String::Archive(Kumu::MemIOWriter* Writer) const
{
  if ( size() > IdentBufferLen )
    {
      DefaultLogSink().Error("String length exceeds maximum %u bytes\n", IdentBufferLen);
      return false;
    }

  const char* mbp = c_str();
  wchar_t wcp;
  ui32_t remainder = size();
  ui32_t length = size();
  ui32_t i = 0;

  mbstate_t ps;
  memset(&ps, 0, sizeof(mbstate_t));

  while ( i < length )
    {
      int count = mbrtowc(&wcp, mbp+i, remainder, &ps);

      if ( count == -1 )
	{
	  DefaultLogSink().Error("Error decoding multi-byte sequence starting at offset %u\n", i);
	  return false;
	}
      else if ( count  == 0 )
	{
	  break;
	}

      bool result = Writer->WriteUi16BE((ui16_t)wcp);

      if ( result == false )
	{
	  DefaultLogSink().Error("No more space in memory IO writer\n");
	  return false;
	}

      i += count;
      remainder -= count;
    }

  return true;
}